

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

ConfidentialTxOutReference * __thiscall
cfd::ConfidentialTransactionController::AddPegoutTxOut
          (ConfidentialTxOutReference *__return_storage_ptr__,
          ConfidentialTransactionController *this,Amount *value,ConfidentialAssetId *asset,
          BlockHash *genesisblock_hash,Address *btc_address,NetType net_type,Pubkey *online_pubkey,
          Privkey *master_online_key,string *btc_descriptor,uint32_t bip32_counter,
          ByteData *whitelist,NetType elements_net_type,Address *btc_derive_address)

{
  bool bVar1;
  Script local_260;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_228;
  PegoutKeyData key_data;
  Script script;
  Script locking_script;
  
  core::Script::Script(&script);
  core::PegoutKeyData::PegoutKeyData(&key_data);
  bVar1 = core::Pubkey::IsValid(online_pubkey);
  if (bVar1) {
    bVar1 = core::Privkey::IsInvalid(master_online_key);
    if (!bVar1) {
      core::Address::Address((Address *)&locking_script);
      core::ByteData::ByteData((ByteData *)&local_228);
      core::ConfidentialTransaction::GetPegoutPubkeyData
                ((PegoutKeyData *)&local_260,online_pubkey,master_online_key,btc_descriptor,
                 bip32_counter,whitelist,net_type,(ByteData *)&local_228,elements_net_type,
                 (Address *)&locking_script);
      core::PegoutKeyData::operator=(&key_data,(PegoutKeyData *)&local_260);
      core::PegoutKeyData::~PegoutKeyData((PegoutKeyData *)&local_260);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_228);
      core::Address::GetAddress_abi_cxx11_((string *)&local_260,(Address *)&locking_script);
      std::__cxx11::string::~string((string *)&local_260);
      if (local_260.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        core::Address::GetLockingScript(&local_260,(Address *)&locking_script);
        core::Script::operator=(&script,&local_260);
        core::Script::~Script(&local_260);
        if (btc_derive_address != (Address *)0x0) {
          core::Address::operator=(btc_derive_address,(Address *)&locking_script);
        }
      }
      core::Address::~Address((Address *)&locking_script);
      goto LAB_00343204;
    }
  }
  core::Address::GetLockingScript(&locking_script,btc_address);
  core::Script::operator=(&script,&locking_script);
  core::Script::~Script(&locking_script);
LAB_00343204:
  core::ScriptUtil::CreatePegoutLogkingScript
            (&locking_script,genesisblock_hash,&script,&key_data.btc_pubkey_bytes,
             &key_data.whitelist_proof);
  AddTxOut(__return_storage_ptr__,this,&locking_script,value,asset);
  core::Script::~Script(&locking_script);
  core::PegoutKeyData::~PegoutKeyData(&key_data);
  core::Script::~Script(&script);
  return __return_storage_ptr__;
}

Assistant:

const ConfidentialTxOutReference
ConfidentialTransactionController::AddPegoutTxOut(
    const Amount& value, const ConfidentialAssetId& asset,
    const BlockHash& genesisblock_hash, const Address& btc_address,
    NetType net_type, const Pubkey& online_pubkey,
    const Privkey& master_online_key, const std::string& btc_descriptor,
    uint32_t bip32_counter, const ByteData& whitelist,
    NetType elements_net_type, Address* btc_derive_address) {
  Script script;
  PegoutKeyData key_data;
  if (online_pubkey.IsValid() && !master_online_key.IsInvalid()) {
    // generate pubkey and whitelistproof
    Address derive_addr;
    key_data = ConfidentialTransaction::GetPegoutPubkeyData(
        online_pubkey, master_online_key, btc_descriptor, bip32_counter,
        whitelist, net_type, ByteData(), elements_net_type, &derive_addr);
    if (!derive_addr.GetAddress().empty()) {
      script = derive_addr.GetLockingScript();
      if (btc_derive_address != nullptr) {
        *btc_derive_address = derive_addr;
      }
    }
  } else {
    script = btc_address.GetLockingScript();
  }

  Script locking_script = ScriptUtil::CreatePegoutLogkingScript(
      genesisblock_hash, script, key_data.btc_pubkey_bytes,
      key_data.whitelist_proof);

  return AddTxOut(locking_script, value, asset);
}